

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *this)

{
  QString *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char16_t *pcVar5;
  QAbstractConcatenable *this_00;
  QChar *in_RCX;
  char16_t *__src;
  QLatin1StringView in;
  QLatin1StringView in_00;
  
  pQVar1 = (this->a).b;
  if (((this->a).a.m_data == (char *)0x0) &&
     (in_RCX = (QChar *)((ulong)(this->b).m_data | (ulong)(pQVar1->d).ptr), in_RCX == (QChar *)0x0))
  {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = (pQVar1->d).size;
    lVar3 = (this->a).a.m_size;
    lVar4 = (this->b).m_size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar2 + lVar3 + lVar4,Uninitialized);
    pcVar5 = (__return_storage_ptr__->d).ptr;
    this_00 = (QAbstractConcatenable *)(this->a).a.m_size;
    in.m_data = (char *)pcVar5;
    in.m_size = (qsizetype)(this->a).a.m_data;
    QAbstractConcatenable::appendLatin1To(this_00,in,in_RCX);
    pcVar5 = pcVar5 + (long)this_00;
    pQVar1 = (this->a).b;
    lVar2 = (pQVar1->d).size;
    if (lVar2 != 0) {
      __src = (pQVar1->d).ptr;
      if (__src == (char16_t *)0x0) {
        __src = &QString::_empty;
      }
      memcpy(pcVar5,__src,lVar2 * 2);
    }
    in_00.m_data = (char *)(pcVar5 + lVar2);
    in_00.m_size = (qsizetype)(this->b).m_data;
    QAbstractConcatenable::appendLatin1To((QAbstractConcatenable *)(this->b).m_size,in_00,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }